

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

string * __thiscall
spirv_cross::ParsedIR::get_member_name_abi_cxx11_(ParsedIR *this,TypeID id,uint32_t index)

{
  Meta *pMVar1;
  Decoration *pDVar2;
  
  pMVar1 = find_meta(this,(ID)id.id);
  if ((pMVar1 == (Meta *)0x0) ||
     ((pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= (ulong)index)
     ) {
    pDVar2 = (Decoration *)&this->empty_string;
  }
  else {
    pDVar2 = (pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr + index;
  }
  return &pDVar2->alias;
}

Assistant:

const string &ParsedIR::get_member_name(TypeID id, uint32_t index) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (index >= m->members.size())
			return empty_string;
		return m->members[index].alias;
	}
	else
		return empty_string;
}